

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O0

void __thiscall cppcms::impl::shared_mutex::~shared_mutex(shared_mutex *this)

{
  noncopyable *in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    fclose(*(FILE **)(in_RDI + 8));
  }
  destroy_rwlock((pthread_rwlock_t *)0x4257e9);
  if (*(noncopyable **)in_RDI != in_RDI + 0x10) {
    munmap(*(void **)in_RDI,0x38);
  }
  booster::noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

~shared_mutex()
		{
			if(flock_) ::fclose(flock_);
			destroy_rwlock(plock_);
			if(plock_ != &normal_)
				::munmap((char*)plock_,sizeof(pthread_rwlock_t));
		}